

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

absolute_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::BreakTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,time_point<seconds> *tp)

{
  pointer pTVar1;
  long unix_time;
  long lVar2;
  pointer pTVar3;
  Transition *tr;
  ulong uVar4;
  difference_type __d;
  ulong uVar5;
  ulong uVar6;
  fields fVar7;
  
  pTVar1 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pTVar3 - (long)pTVar1;
  if (uVar4 == 0) {
    __assert_fail("timecnt != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                  ,0x376,
                  "virtual time_zone::absolute_lookup absl::time_internal::cctz::TimeZoneInfo::BreakTime(const time_point<seconds> &) const"
                 );
  }
  unix_time = (tp->__d).__r;
  if (unix_time < pTVar1->unix_time) {
    LocalTime(__return_storage_ptr__,this,unix_time,
              (TransitionType *)
              ((long)&((this->transition_types_).
                       super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                       ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
              (ulong)((uint)this->default_transition_type_ * 0x30)));
  }
  else {
    lVar2 = *(long *)((long)pTVar1 + (uVar4 - 0x30));
    if (unix_time < lVar2) {
      uVar6 = (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i;
      if ((((uVar6 == 0) ||
           ((ulong)(((long)pTVar3 - (long)pTVar1 >> 4) * -0x5555555555555555) <= uVar6)) ||
          (unix_time < pTVar1[uVar6 - 1].unix_time)) || (pTVar1[uVar6].unix_time <= unix_time)) {
        pTVar3 = pTVar1;
        if (0 < (long)uVar4) {
          uVar4 = (uVar4 >> 4) * -0x5555555555555555;
          do {
            uVar5 = uVar4 >> 1;
            uVar6 = uVar5;
            if (pTVar3[uVar5].unix_time <= unix_time) {
              uVar6 = ~uVar5 + uVar4;
              pTVar3 = pTVar3 + uVar5 + 1;
            }
            uVar4 = uVar6;
          } while (0 < (long)uVar6);
        }
        (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i =
             ((long)pTVar3 - (long)pTVar1 >> 4) * -0x5555555555555555;
        tr = pTVar3 + -1;
      }
      else {
        tr = pTVar1 + (uVar6 - 1);
      }
    }
    else {
      if (this->extended_ == true) {
        (*(this->super_TimeZoneIf)._vptr_TimeZoneIf[2])(__return_storage_ptr__);
        fVar7 = detail::impl::n_sec(((unix_time - lVar2) / 0x2f0605980 + 1) * 400 +
                                    (__return_storage_ptr__->cs).f_.y,
                                    (long)(__return_storage_ptr__->cs).f_.m,
                                    (long)(__return_storage_ptr__->cs).f_.d,
                                    (long)(__return_storage_ptr__->cs).f_.hh,
                                    (long)(__return_storage_ptr__->cs).f_.mm,
                                    (long)(__return_storage_ptr__->cs).f_.ss);
        uVar4 = fVar7._8_8_ & 0xffffffffff;
        (__return_storage_ptr__->cs).f_.y = fVar7.y;
        (__return_storage_ptr__->cs).f_.m = (char)uVar4;
        (__return_storage_ptr__->cs).f_.d = (char)(uVar4 >> 8);
        (__return_storage_ptr__->cs).f_.hh = (char)(uVar4 >> 0x10);
        (__return_storage_ptr__->cs).f_.mm = (char)(uVar4 >> 0x18);
        (__return_storage_ptr__->cs).f_.ss = (char)(uVar4 >> 0x20);
        *(int3 *)&(__return_storage_ptr__->cs).f_.field_0xd = (int3)(uVar4 >> 0x28);
        return __return_storage_ptr__;
      }
      tr = (Transition *)((long)pTVar1 + (uVar4 - 0x30));
    }
    LocalTime(__return_storage_ptr__,this,unix_time,tr);
  }
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::BreakTime(
    const time_point<seconds>& tp) const {
  std::int_fast64_t unix_time = ToUnixSeconds(tp);
  const std::size_t timecnt = transitions_.size();
  assert(timecnt != 0);  // We always add a transition.

  if (unix_time < transitions_[0].unix_time) {
    return LocalTime(unix_time, transition_types_[default_transition_type_]);
  }
  if (unix_time >= transitions_[timecnt - 1].unix_time) {
    // After the last transition. If we extended the transitions using
    // future_spec_, shift back to a supported year using the 400-year
    // cycle of calendaric equivalence and then compensate accordingly.
    if (extended_) {
      const std::int_fast64_t diff =
          unix_time - transitions_[timecnt - 1].unix_time;
      const year_t shift = diff / kSecsPer400Years + 1;
      const auto d = seconds(shift * kSecsPer400Years);
      time_zone::absolute_lookup al = BreakTime(tp - d);
      al.cs = YearShift(al.cs, shift * 400);
      return al;
    }
    return LocalTime(unix_time, transitions_[timecnt - 1]);
  }

  const std::size_t hint = local_time_hint_.load(std::memory_order_relaxed);
  if (0 < hint && hint < timecnt) {
    if (transitions_[hint - 1].unix_time <= unix_time) {
      if (unix_time < transitions_[hint].unix_time) {
        return LocalTime(unix_time, transitions_[hint - 1]);
      }
    }
  }

  const Transition target = {unix_time, 0, civil_second(), civil_second()};
  const Transition* begin = &transitions_[0];
  const Transition* tr = std::upper_bound(begin, begin + timecnt, target,
                                          Transition::ByUnixTime());
  local_time_hint_.store(static_cast<std::size_t>(tr - begin),
                         std::memory_order_relaxed);
  return LocalTime(unix_time, *--tr);
}